

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

Read<int> __thiscall Omega_h::multiply_each_by<int>(Omega_h *this,Read<int> *a,int b)

{
  int *piVar1;
  Alloc *pAVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar3;
  size_t sVar4;
  Read<int> RVar5;
  Write<int> c;
  type_conflict f;
  Write<int> local_78;
  type_conflict local_60;
  Write<int> local_38;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar4 = pAVar2->size;
  }
  else {
    sVar4 = (ulong)pAVar2 >> 3;
  }
  local_60.c.shared_alloc_.alloc = (Alloc *)&local_60.a;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  Write<int>::Write(&local_78,(LO)(sVar4 >> 2),(string *)&local_60);
  if (local_60.c.shared_alloc_.alloc != (Alloc *)&local_60.a) {
    operator_delete(local_60.c.shared_alloc_.alloc,
                    (ulong)((long)&(local_60.a.write_.shared_alloc_.alloc)->size + 1));
  }
  local_60.c.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_60.c.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_60.c.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
  pAVar2 = (a->write_).shared_alloc_.alloc;
  local_60.a.write_.shared_alloc_.alloc = pAVar2;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.a.write_.shared_alloc_.alloc = (Alloc *)(pAVar2->size * 8 + 1);
    }
    else {
      pAVar2->use_count = pAVar2->use_count + 1;
    }
  }
  local_60.a.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar4 = pAVar2->size;
  }
  else {
    sVar4 = (ulong)pAVar2 >> 3;
  }
  local_60.b = b;
  parallel_for<Omega_h::multiply_each_by<int>(Omega_h::Read<int>,int)::_lambda(int)_1_>
            ((LO)(sVar4 >> 2),&local_60,"multiply_each_by");
  local_38.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
  local_38.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
  if ((((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
       local_78.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + -1;
    local_38.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_78.shared_alloc_.alloc = (Alloc *)0x0;
  local_78.shared_alloc_.direct_ptr = (void *)0x0;
  Read<int>::Read((Read<signed_char> *)this,&local_38);
  pAVar2 = local_38.shared_alloc_.alloc;
  pvVar3 = extraout_RDX;
  if (((ulong)local_38.shared_alloc_.alloc & 7) == 0 && local_38.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_38.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_00;
    }
  }
  pAVar2 = local_60.a.write_.shared_alloc_.alloc;
  if (((ulong)local_60.a.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.a.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_60.a.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.a.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_01;
    }
  }
  pAVar2 = local_60.c.shared_alloc_.alloc;
  if (((ulong)local_60.c.shared_alloc_.alloc & 7) == 0 &&
      local_60.c.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_60.c.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.c.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_02;
    }
  }
  pAVar2 = local_78.shared_alloc_.alloc;
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_03;
    }
  }
  RVar5.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar5.write_.shared_alloc_;
}

Assistant:

Read<T> multiply_each_by(Read<T> a, T b) {
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = a[i] * b; };
  parallel_for(a.size(), f, "multiply_each_by");
  return c;
}